

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsExecuter.h
# Opt level: O1

bool __thiscall
Refal2::COperationsExecuter::matchLeftWithQualifierSaveToTable_W
          (COperationsExecuter *this,TQualifierIndex qualifier)

{
  int iVar1;
  anon_union_8_5_86ac0f1f_for_CUnit_1 aVar2;
  bool bVar3;
  CNode<Refal2::CUnit> *unit;
  int iVar4;
  undefined8 local_18;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  unit = this->left->next;
  this->left = unit;
  if (unit == (CNode<Refal2::CUnit> *)0x0) {
    __assert_fail("left != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/include/OperationsExecuter.h"
                  ,0x104,"bool Refal2::COperationsExecuter::shiftLeft()");
  }
  if (unit == this->right) {
    return false;
  }
  if (((unit->super_CUnit).type & UT_Label) != 0) {
    iVar1 = (unit->super_CUnit).field_1.label;
    iVar4 = iVar1 + 0xffff;
    if (-1 < iVar1) {
      iVar4 = iVar1;
    }
    if (iVar4 >> 0x10 != (this->super_CExecutionContext).RuntimeModuleId) {
      bVar3 = (bool)(((byte)qualifier->flags & 4) >> 2);
      goto LAB_0012654e;
    }
    local_18._0_4_ = (unit->super_CUnit).type;
    local_18._4_4_ = *(undefined4 *)&(unit->super_CUnit).field_0x4;
    aVar2 = (unit->super_CUnit).field_1;
    uStack_10 = aVar2.label;
    uStack_c = aVar2._4_4_;
    uStack_10 = (int)uStack_10 % 0x10000;
    unit = (CNode<Refal2::CUnit> *)&local_18;
  }
  bVar3 = CQualifier::Check(qualifier,&unit->super_CUnit);
LAB_0012654e:
  if (bVar3 == false) {
    return false;
  }
  iVar1 = this->tableTop;
  if (iVar1 < (((this->super_CExecutionContext).Program.
                super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_CCompilationContext).maxTableSize) {
    this->table[iVar1] = this->left;
    this->tableTop = iVar1 + 1;
    if (((this->left->super_CUnit).type & (UT_RightParen|UT_LeftParen)) != 0) {
      this->left = (CUnitNode *)(this->left->super_CUnit).field_1;
    }
    if (iVar1 + 1 <
        (((this->super_CExecutionContext).Program.
          super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_CCompilationContext).maxTableSize) {
      this->table[(long)iVar1 + 1] = this->left;
      this->tableTop = iVar1 + 2;
      return true;
    }
  }
  __assert_fail("tableTop < Program->MaxTableSize()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/include/OperationsExecuter.h"
                ,0xef,"void Refal2::COperationsExecuter::saveToTable(CUnitNode *const)");
}

Assistant:

inline bool COperationsExecuter::shiftLeft()
{
	left = left->Next();
	assert( left != nullptr );
	return ( left != right );
}